

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *path)

{
  bool bVar1;
  WorkingMode WVar2;
  ulong uVar3;
  pointer this_00;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  undefined1 local_eb0 [8];
  string file;
  cmMakefile mf;
  cmStateDirectory local_a8;
  undefined1 local_80 [8];
  cmStateSnapshot snapshot;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_60;
  PositionType local_58;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_38;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_30;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  cmGlobalGenerator *gg;
  string *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
       GetGlobalGenerator(this);
  std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
  unique_ptr<std::default_delete<cmGlobalGenerator>,void>
            ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)&local_30);
  if ((__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)
      gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
      _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0) {
    std::make_unique<cmGlobalGenerator,cmake*>((cmake **)&local_38);
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator=
              (&local_30,&local_38);
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
              (&local_38);
    gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::get(&local_30)
    ;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    cmState::Reset((cmStateSnapshot *)&snapshot.Position.Position,this_00);
    (this->CurrentSnapshot).Position.Position = local_58;
    (this->CurrentSnapshot).State = (cmState *)snapshot.Position.Position;
    (this->CurrentSnapshot).Position.Tree = pcStack_60;
    GetCurrentSnapshot((cmStateSnapshot *)local_80,this);
    cmStateSnapshot::GetDirectory(&local_a8,(cmStateSnapshot *)local_80);
    psVar4 = GetHomeOutputDirectory_abi_cxx11_(this);
    cmStateDirectory::SetCurrentBinary(&local_a8,psVar4);
    cmStateSnapshot::GetDirectory
              ((cmStateDirectory *)&mf.IsSourceFileTryCompile,(cmStateSnapshot *)local_80);
    psVar4 = GetHomeDirectory_abi_cxx11_(this);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)&mf.IsSourceFileTryCompile,psVar4);
    cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_80);
    cmMakefile::cmMakefile
              ((cmMakefile *)((long)&file.field_2 + 8),
               (cmGlobalGenerator *)
               gen._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
               (cmStateSnapshot *)local_80);
    WVar2 = GetWorkingMode(this);
    if (WVar2 != NORMAL_MODE) {
      cmsys::SystemTools::CollapseFullPath((string *)local_eb0,path);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_eb0);
      cmMakefile::SetScriptModeFile((cmMakefile *)((long)&file.field_2 + 8),(string *)local_eb0);
      cmMakefile::SetArgcArgv((cmMakefile *)((long)&file.field_2 + 8),args);
      std::__cxx11::string::~string((string *)local_eb0);
    }
    bVar1 = cmsys::SystemTools::FileExists(path,true);
    if (!bVar1) {
      std::operator+(&local_ed0,"Not a file: ",path);
      cmSystemTools::Error(&local_ed0);
      std::__cxx11::string::~string((string *)&local_ed0);
    }
    bVar1 = cmMakefile::ReadListFile((cmMakefile *)((long)&file.field_2 + 8),path);
    if (!bVar1) {
      std::operator+(&local_ef0,"Error processing file: ",path);
      cmSystemTools::Error(&local_ef0);
      std::__cxx11::string::~string((string *)&local_ef0);
    }
    cmMakefile::~cmMakefile((cmMakefile *)((long)&file.field_2 + 8));
  }
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            (&local_30);
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const std::string& path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();

  // if a generator was not specified use a generic one
  std::unique_ptr<cmGlobalGenerator> gen;
  if (!gg) {
    gen = cm::make_unique<cmGlobalGenerator>(this);
    gg = gen.get();
  }

  // read in the list file to fill the cache
  if (!path.empty()) {
    this->CurrentSnapshot = this->State->Reset();
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(this->GetHomeOutputDirectory());
    snapshot.GetDirectory().SetCurrentSource(this->GetHomeDirectory());
    snapshot.SetDefaultDefinitions();
    cmMakefile mf(gg, snapshot);
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf.SetScriptModeFile(file);

      mf.SetArgcArgv(args);
    }
    if (!cmSystemTools::FileExists(path, true)) {
      cmSystemTools::Error("Not a file: " + path);
    }
    if (!mf.ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: " + path);
    }
  }
}